

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.h
# Opt level: O2

void __thiscall cell_map::cell_map(cell_map *this,int w,int h)

{
  ulong in_RAX;
  undefined8 uStack_18;
  
  this->width = w;
  this->height = h;
  (this->cells).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cells).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cells).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_18 = in_RAX & 0xffffffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->cells,(long)(h * w),(value_type *)((long)&uStack_18 + 7));
  return;
}

Assistant:

cell_map(int w, int h) : width(w), height(h)
    {
    cells.resize(w*h, 0);
    }